

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_vectors.h
# Opt level: O2

void __thiscall
Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>::
Vector_distances_in_diagram
          (Vector_distances_in_diagram<Gudhi::Euclidean_distance> *this,char *filename,
          size_t where_to_cut,uint dimension)

{
  size_t sVar1;
  uint dimension_00;
  allocator<char> local_79;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> intervals;
  string local_58 [32];
  _Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> local_38;
  
  (this->sorted_vector_of_distances).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->sorted_vector_of_distances).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->intervals).
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->sorted_vector_of_distances).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->intervals).
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->intervals).
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  this->where_to_cut = where_to_cut;
  intervals.
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  intervals.
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  intervals.
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (dimension == 0xffffffff) {
    std::__cxx11::string::string<std::allocator<char>>(local_58,filename,&local_79);
    read_persistence_intervals_in_one_dimension_from_file
              ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
               &local_38,(Persistence_representations *)local_58,(string *)0xffffffffffffffff,
               dimension,-1.0);
  }
  else {
    dimension_00 = dimension;
    std::__cxx11::string::string<std::allocator<char>>(local_58,filename,&local_79);
    read_persistence_intervals_in_one_dimension_from_file
              ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
               &local_38,(Persistence_representations *)local_58,(string *)(ulong)dimension,
               dimension_00,-1.0);
  }
  std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
  _M_move_assign(&intervals,&local_38);
  std::_Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
  ~_Vector_base(&local_38);
  std::__cxx11::string::~string(local_58);
  std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::operator=
            (&this->intervals,&intervals);
  compute_sorted_vector_of_distances_via_heap(this,where_to_cut);
  sVar1 = (long)(this->sorted_vector_of_distances).
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_finish -
          (long)(this->sorted_vector_of_distances).
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start >> 3;
  this->number_of_functions_for_vectorization = sVar1;
  this->number_of_functions_for_projections_to_reals = sVar1;
  std::_Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
  ~_Vector_base(&intervals.
                 super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               );
  return;
}

Assistant:

Vector_distances_in_diagram<F>::Vector_distances_in_diagram(const char* filename, size_t where_to_cut,
                                                            unsigned dimension)
    : where_to_cut(where_to_cut) {
  std::vector<std::pair<double, double> > intervals;
  if (dimension == std::numeric_limits<unsigned>::max()) {
    intervals = read_persistence_intervals_in_one_dimension_from_file(filename);
  } else {
    intervals = read_persistence_intervals_in_one_dimension_from_file(filename, dimension);
  }
  this->intervals = intervals;
  this->compute_sorted_vector_of_distances_via_heap(where_to_cut);
  // this->compute_sorted_vector_of_distances_via_vector_sorting( where_to_cut );
  set_up_numbers_of_functions_for_vectorization_and_projections_to_reals();
}